

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_utils.h
# Opt level: O3

uint64_t SipHash(uint64_t k0,uint64_t k1,uint64_t data)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    uVar2 = k1 ^ 0x646f72616e646f6d;
    uVar1 = (k0 ^ 0x736f6d6570736575) + uVar2;
    uVar2 = (uVar2 << 0xd | uVar2 >> 0x33) ^ uVar1;
    uVar3 = k1 ^ data ^ 0x7465646279746573;
    uVar4 = (k0 ^ 0x6c7967656e657261) + uVar3;
    uVar3 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar4;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar3;
    uVar4 = uVar4 + uVar2;
    uVar2 = (uVar2 << 0x11 | uVar2 >> 0x2f) ^ uVar4;
    uVar3 = (uVar3 << 0x15 | uVar3 >> 0x2b) ^ uVar1;
    uVar1 = uVar1 + uVar2;
    uVar2 = (uVar2 << 0xd | uVar2 >> 0x33) ^ uVar1;
    uVar5 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar3;
    uVar4 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar5;
    uVar1 = (uVar1 << 0x20 | uVar1 >> 0x20) + uVar4;
    uVar5 = uVar5 + uVar2;
    uVar2 = (uVar2 << 0x11 | uVar2 >> 0x2f) ^ uVar5;
    uVar3 = (data ^ uVar1) + uVar2;
    uVar1 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar1;
    uVar2 = (uVar2 << 0xd | uVar2 >> 0x33) ^ uVar3;
    uVar4 = uVar1 ^ 0x800000000000000;
    uVar5 = (uVar5 << 0x20 | uVar5 >> 0x20) + uVar4;
    uVar4 = (uVar1 << 0x10 | uVar4 >> 0x30) ^ uVar5;
    uVar3 = (uVar3 << 0x20 | uVar3 >> 0x20) + uVar4;
    uVar5 = uVar5 + uVar2;
    uVar1 = (uVar2 << 0x11 | uVar2 >> 0x2f) ^ uVar5;
    uVar2 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar3;
    uVar3 = uVar3 + uVar1;
    uVar1 = (uVar1 << 0xd | uVar1 >> 0x33) ^ uVar3;
    uVar5 = (uVar5 << 0x20 | uVar5 >> 0x20) + uVar2;
    uVar4 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar5;
    uVar2 = (uVar3 << 0x20 | uVar3 >> 0x20) + uVar4;
    uVar5 = uVar5 + uVar1;
    uVar3 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar2;
    uVar1 = (uVar1 << 0x11 | uVar1 >> 0x2f) ^ uVar5;
    uVar2 = (uVar2 ^ 0x800000000000000) + uVar1;
    uVar1 = (uVar1 << 0xd | uVar1 >> 0x33) ^ uVar2;
    uVar4 = ((uVar5 << 0x20 | uVar5 >> 0x20) ^ 0xff) + uVar3;
    uVar3 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar4;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar3;
    uVar4 = uVar4 + uVar1;
    uVar1 = (uVar1 << 0x11 | uVar1 >> 0x2f) ^ uVar4;
    uVar3 = (uVar3 << 0x15 | uVar3 >> 0x2b) ^ uVar2;
    uVar2 = uVar2 + uVar1;
    uVar1 = (uVar1 << 0xd | uVar1 >> 0x33) ^ uVar2;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar3;
    uVar3 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar4;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar3;
    uVar4 = uVar4 + uVar1;
    uVar1 = (uVar1 << 0x11 | uVar1 >> 0x2f) ^ uVar4;
    uVar3 = (uVar3 << 0x15 | uVar3 >> 0x2b) ^ uVar2;
    uVar2 = uVar2 + uVar1;
    uVar1 = (uVar1 << 0xd | uVar1 >> 0x33) ^ uVar2;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar3;
    uVar3 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar4;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar3;
    uVar4 = uVar4 + uVar1;
    uVar1 = (uVar1 << 0x11 | uVar1 >> 0x2f) ^ uVar4;
    uVar3 = (uVar3 << 0x15 | uVar3 >> 0x2b) ^ uVar2;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar3;
    uVar3 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar4;
    uVar1 = (uVar1 << 0xd | uVar1 >> 0x33) ^ uVar2 + uVar1;
    uVar4 = uVar4 + uVar1;
    return (uVar4 << 0x20 | uVar4 >> 0x20) ^ uVar4 ^
           (uVar1 << 0x11 | uVar1 >> 0x2f) ^ (uVar3 << 0x15 | uVar3 >> 0x2b);
  }
  __stack_chk_fail();
}

Assistant:

inline uint64_t SipHash(uint64_t k0, uint64_t k1, uint64_t data) {
    uint64_t v0 = 0x736f6d6570736575ULL ^ k0;
    uint64_t v1 = 0x646f72616e646f6dULL ^ k1;
    uint64_t v2 = 0x6c7967656e657261ULL ^ k0;
    uint64_t v3 = 0x7465646279746573ULL ^ k1 ^ data;
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    v0 ^= data;
    v3 ^= 0x800000000000000ULL;
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    v0 ^= 0x800000000000000ULL;
    v2 ^= 0xFF;
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    SipHashRound(v0, v1, v2, v3);
    return v0 ^ v1 ^ v2 ^ v3;
}